

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<long,std::__cxx11::string>::
MapAllocator<google::protobuf::Map<long,std::__cxx11::string>::KeyValuePair>::
construct<google::protobuf::Map<long,std::__cxx11::string>::KeyValuePair,google::protobuf::Map<long,std::__cxx11::string>::KeyValuePair_const&>
          (MapAllocator<google::protobuf::Map<long,std::__cxx11::string>::KeyValuePair> *this,
          KeyValuePair *p,KeyValuePair *args)

{
  KeyValuePair *args_local;
  KeyValuePair *p_local;
  MapAllocator<google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
  *this_local;
  
  p->k_ = args->k_;
  p->v_ = args->v_;
  return;
}

Assistant:

void construct(NodeType* p, Args&&... args) {
      // Clang 3.6 doesn't compile static casting to void* directly. (Issue
      // #1266) According C++ standard 5.2.9/1: "The static_cast operator shall
      // not cast away constness". So first the maybe const pointer is casted to
      // const void* and after the const void* is const casted.
      new (const_cast<void*>(static_cast<const void*>(p)))
          NodeType(std::forward<Args>(args)...);
    }